

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::SmallDenseMap
          (SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>
           *this,Allocator *allocator)

{
  this->allocator = allocator;
  this->bucketCount = 0x80;
  this->count = 0;
  this->data = this->storage;
  NULLC::fillMemory(this->storage,0,0x800);
  return;
}

Assistant:

SmallDenseMap(Allocator *allocator = 0): allocator(allocator)
	{
		assert(N >= 2 && "size is too small");
		assert((N & (N - 1)) == 0 && "only power of 2 sizes are supported");

		bucketCount = N;

		count = 0;

		data = storage;

		NULLC::fillMemory(data, 0, sizeof(Node) * bucketCount);
	}